

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProString::endsWith(ProString *this,QString *sub,CaseSensitivity cs)

{
  undefined1 uVar1;
  CutResult CVar2;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  long local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (this->m_string).d.ptr;
  local_28 = (long)this->m_offset;
  local_30 = (long)this->m_length;
  CVar2 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_28,&local_30);
  if (CVar2 == Null) {
    lVar4 = 0;
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = pcVar3 + local_28;
    lVar4 = local_30;
  }
  QVar5.m_data = pcVar3;
  QVar5.m_size = lVar4;
  QVar6.m_data = (sub->d).ptr;
  QVar6.m_size = (sub->d).size;
  uVar1 = QtPrivate::endsWith(QVar5,QVar6,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const QString &sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().endsWith(sub, cs); }